

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_value_pointer(sqlite3_value *pVal,char *zPType)

{
  int iVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  Mem *p;
  
  if (((((*(ushort *)((long)in_RDI + 0x14) & 0xfbf) == 0xa01) && (in_RSI != (char *)0x0)) &&
      (*(char *)((long)in_RDI + 0x17) == 'p')) &&
     (iVar1 = strcmp((char *)*in_RDI,in_RSI), iVar1 == 0)) {
    return (void *)in_RDI[1];
  }
  return (void *)0x0;
}

Assistant:

SQLITE_API void *sqlite3_value_pointer(sqlite3_value *pVal, const char *zPType){
  Mem *p = (Mem*)pVal;
  if( (p->flags&(MEM_TypeMask|MEM_Term|MEM_Subtype)) ==
                 (MEM_Null|MEM_Term|MEM_Subtype)
   && zPType!=0
   && p->eSubtype=='p'
   && strcmp(p->u.zPType, zPType)==0
  ){
    return (void*)p->z;
  }else{
    return 0;
  }
}